

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O2

int YPSpur_md_isfreeze(YPSpur *spur)

{
  int iVar1;
  YPSpur_msg msg;
  
  msg.msg_type = 1;
  msg.pid = (long)spur->pid;
  msg.type = 0x202;
  msg.cs = 0;
  iVar1 = (*(spur->dev).send)(&spur->dev,&msg);
  if ((-1 < iVar1) && (iVar1 = (*(spur->dev).recv)(&spur->dev,&msg), -1 < iVar1)) {
    return (int)msg.data[0];
  }
  spur->connection_error = 1;
  return -1;
}

Assistant:

int YPSpur_md_isfreeze(YPSpur* spur)
{
  YPSpur_msg msg;
  int len;
  int ret;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_ISFREEZE;
  msg.cs = 0;
  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  /* 指定のコマンド受け取り */
  len = spur->dev.recv(&spur->dev, &msg);
  if (len < 0)
  {
    /* receive error */
    spur->connection_error = 1;
    return -1;
  }

  ret = (int)msg.data[0];
  return ret;
}